

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O1

string * bech32::stripUnknownChars(string *__return_storage_ptr__,string *bstring)

{
  _Iter_pred<bech32::stripUnknownChars(std::__cxx11::string_const&)::__0> *p_Var1;
  ulong uVar2;
  bool bVar3;
  long lVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __it;
  _Iter_pred<bech32::stripUnknownChars(std::__cxx11::string_const&)::__0> *this;
  _Iter_pred<bech32::stripUnknownChars(std::__cxx11::string_const&)::__0> *p_Var5;
  _Iter_pred<bech32::stripUnknownChars(std::__cxx11::string_const&)::__0> *p_Var6;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __it._M_current = (bstring->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,__it._M_current,
             __it._M_current + bstring->_M_string_length);
  p_Var5 = (_Iter_pred<bech32::stripUnknownChars(std::__cxx11::string_const&)::__0> *)
           (__return_storage_ptr__->_M_dataplus)._M_p;
  uVar2 = __return_storage_ptr__->_M_string_length;
  p_Var1 = p_Var5 + uVar2;
  this = p_Var5;
  if (0 < (long)uVar2 >> 2) {
    this = p_Var5 + (uVar2 & 0xfffffffffffffffc);
    lVar4 = ((long)uVar2 >> 2) + 1;
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<bech32::stripUnknownChars(std::__cxx11::string_const&)::$_0>::operator()
                        (p_Var5,__it);
      p_Var6 = p_Var5;
      if (bVar3) goto LAB_001024be;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<bech32::stripUnknownChars(std::__cxx11::string_const&)::$_0>::operator()
                        (p_Var5 + 1,__it);
      p_Var6 = p_Var5 + 1;
      if (bVar3) goto LAB_001024be;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<bech32::stripUnknownChars(std::__cxx11::string_const&)::$_0>::operator()
                        (p_Var5 + 2,__it);
      p_Var6 = p_Var5 + 2;
      if (bVar3) goto LAB_001024be;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<bech32::stripUnknownChars(std::__cxx11::string_const&)::$_0>::operator()
                        (p_Var5 + 3,__it);
      p_Var6 = p_Var5 + 3;
      if (bVar3) goto LAB_001024be;
      p_Var5 = p_Var5 + 4;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  lVar4 = (long)p_Var1 - (long)this;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      p_Var6 = p_Var1;
      if ((lVar4 != 3) ||
         (bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<bech32::stripUnknownChars(std::__cxx11::string_const&)::$_0>::
                  operator()(this,__it), p_Var6 = this, bVar3)) goto LAB_001024be;
      this = this + 1;
    }
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<bech32::stripUnknownChars(std::__cxx11::string_const&)::$_0>::operator()
                      (this,__it);
    p_Var6 = this;
    if (bVar3) goto LAB_001024be;
    this = this + 1;
  }
  bVar3 = __gnu_cxx::__ops::_Iter_pred<bech32::stripUnknownChars(std::__cxx11::string_const&)::$_0>
          ::operator()(this,__it);
  p_Var6 = this;
  if (!bVar3) {
    p_Var6 = p_Var1;
  }
LAB_001024be:
  p_Var5 = p_Var6 + 1;
  if (p_Var5 != p_Var1 && p_Var6 != p_Var1) {
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<bech32::stripUnknownChars(std::__cxx11::string_const&)::$_0>::operator()
                        (p_Var5,__it);
      if (!bVar3) {
        *p_Var6 = *p_Var5;
        p_Var6 = p_Var6 + 1;
      }
      p_Var5 = p_Var5 + 1;
    } while (p_Var5 != p_Var1);
  }
  __return_storage_ptr__->_M_string_length =
       (long)p_Var6 - (long)(__return_storage_ptr__->_M_dataplus)._M_p;
  *p_Var6 = (_Iter_pred<bech32::stripUnknownChars(std::__cxx11::string_const&)::__0>)0x0;
  return __return_storage_ptr__;
}

Assistant:

std::string stripUnknownChars(const std::string &bstring) {
        std::string ret(bstring);
        ret.erase(
                std::remove_if(
                        ret.begin(), ret.end(),
                        [](char x){return (!isAllowedChar(static_cast<char>(::tolower(x))) && x!=separator);}),
                ret.end());
        return ret;
    }